

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_management.c
# Opt level: O1

AMQP_VALUE on_message_received(void *context,MESSAGE_HANDLE message)

{
  uint64_t uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  LOGGER_LOG p_Var6;
  AMQP_VALUE pAVar7;
  AMQP_VALUE key;
  AMQP_VALUE value;
  AMQP_VALUE key_00;
  LIST_ITEM_HANDLE item_handle;
  undefined8 *puVar8;
  uint64_t uVar9;
  char *pcVar10;
  char cVar11;
  int32_t status_code;
  char *status_description;
  PROPERTIES_HANDLE response_properties;
  AMQP_VALUE application_properties;
  uint64_t correlation_id;
  AMQP_VALUE correlation_id_value;
  int local_84;
  char *local_80;
  uint64_t local_78;
  PROPERTIES_HANDLE local_70;
  AMQP_VALUE local_68;
  AMQP_VALUE local_60;
  AMQP_VALUE local_58;
  AMQP_VALUE local_50;
  AMQP_VALUE local_48;
  uint64_t local_40;
  AMQP_VALUE local_38;
  
  if (context == (void *)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                ,"on_message_received",0x49,1,"NULL context in on_message_received");
      return (AMQP_VALUE)0x0;
    }
    return (AMQP_VALUE)0x0;
  }
  iVar4 = message_get_application_properties(message,&local_68);
  if (iVar4 != 0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                ,"on_message_received",0x55,1,"Could not retrieve application properties");
    }
    (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
    pAVar7 = messaging_delivery_rejected
                       ("amqp:internal-error",
                        "Could not get application properties on AMQP management response.");
    return pAVar7;
  }
  iVar4 = message_get_properties(message,&local_70);
  if (iVar4 != 0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                ,"on_message_received",0x62,1,"Could not retrieve message properties");
    }
    (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
    pAVar7 = messaging_delivery_rejected
                       ("amqp:internal-error",
                        "Could not get message properties on AMQP management response.");
    goto LAB_00129f11;
  }
  iVar4 = properties_get_correlation_id(local_70,&local_38);
  if (iVar4 == 0) {
    iVar4 = amqpvalue_get_ulong(local_38,&local_40);
    if (iVar4 != 0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        pcVar10 = "Could not retrieve correlation Id ulong value";
        iVar4 = 0x7f;
        goto LAB_00129edf;
      }
      goto LAB_00129eea;
    }
    pAVar7 = amqpvalue_get_inplace_described_value(local_68);
    if (pAVar7 == (AMQP_VALUE)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                  ,"on_message_received",0x8c,1,"Could not retrieve application property map");
      }
      (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
      pcVar10 = 
      "Could not get application property map from the application properties in the AMQP management response."
      ;
      goto LAB_00129eff;
    }
    key = amqpvalue_create_string(*(char **)((long)context + 0x58));
    if (key == (AMQP_VALUE)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                  ,"on_message_received",0x99,1,"Could not create status-code amqp value");
      }
      (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
      pAVar7 = messaging_delivery_released();
    }
    else {
      value = amqpvalue_get_map_value(pAVar7,key);
      if (value == (AMQP_VALUE)0x0) {
        p_Var6 = xlogging_get_log_function();
        if (p_Var6 != (LOGGER_LOG)0x0) {
          (*p_Var6)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                    ,"on_message_received",0xa5,1,
                    "Could not retrieve status code from application properties");
        }
        (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
        pAVar7 = messaging_delivery_rejected
                           ("amqp:internal-error",
                            "Could not retrieve status code from the application properties in the AMQP management response."
                           );
      }
      else {
        iVar4 = amqpvalue_get_int(value,&local_84);
        if (iVar4 == 0) {
          key_00 = amqpvalue_create_string(*(char **)((long)context + 0x60));
          if (key_00 == (AMQP_VALUE)0x0) {
            p_Var6 = xlogging_get_log_function();
            if (p_Var6 != (LOGGER_LOG)0x0) {
              (*p_Var6)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                        ,"on_message_received",0xbe,1,
                        "Could not create status-description amqp value");
            }
            (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
            pAVar7 = messaging_delivery_released();
          }
          else {
            local_80 = (char *)0x0;
            local_58 = key_00;
            local_60 = amqpvalue_get_map_value(pAVar7,key_00);
            local_50 = value;
            local_48 = key;
            if ((local_60 == (AMQP_VALUE)0x0) ||
               (iVar4 = amqpvalue_get_string(local_60,&local_80), iVar4 != 0)) {
              local_80 = (char *)0x0;
            }
            item_handle = singlylinkedlist_get_head_item
                                    (*(SINGLYLINKEDLIST_HANDLE *)((long)context + 0x20));
            bVar2 = false;
            bVar3 = false;
            do {
              if (item_handle == (LIST_ITEM_HANDLE)0x0) break;
              puVar8 = (undefined8 *)singlylinkedlist_item_get_value(item_handle);
              if (puVar8 == (undefined8 *)0x0) {
                p_Var6 = xlogging_get_log_function();
                if (p_Var6 != (LOGGER_LOG)0x0) {
                  (*p_Var6)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                            ,"on_message_received",0xe3,1,
                            "Could not create status-description amqp value");
                }
                (**(code **)((long)context + 0x40))();
                messaging_delivery_released();
                iVar4 = 0x17;
              }
              else {
                uVar1 = puVar8[2];
                iVar4 = 0;
                uVar9 = local_40;
                if (local_40 == uVar1) {
                  local_78 = local_40;
                  if (*(char *)(puVar8 + 3) == '\0') {
                    p_Var6 = xlogging_get_log_function();
                    if (p_Var6 != (LOGGER_LOG)0x0) {
                      (*p_Var6)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                                ,"on_message_received",0xf4,1,
                                "Did not receive send confirmation for pending operation");
                    }
                    iVar4 = async_operation_cancel((ASYNC_OPERATION_HANDLE)puVar8[5]);
                    cVar11 = '\x03';
                    if (iVar4 != 0) {
                      p_Var6 = xlogging_get_log_function();
                      bVar2 = true;
                      if (p_Var6 != (LOGGER_LOG)0x0) {
                        (*p_Var6)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                                  ,"on_message_received",0xf9,1,
                                  "Failed cancelling pending send operation");
                      }
                    }
                  }
                  else {
                    cVar11 = (local_84 - 300U < 0xffffff9c) * '\x02' + '\x01';
                  }
                  if ((code *)*puVar8 != (code *)0x0) {
                    (*(code *)*puVar8)(puVar8[1],cVar11,local_84,local_80,message);
                  }
                  async_operation_destroy((ASYNC_OPERATION_HANDLE)puVar8[6]);
                  iVar5 = singlylinkedlist_remove
                                    (*(SINGLYLINKEDLIST_HANDLE *)((long)context + 0x20),item_handle)
                  ;
                  iVar4 = 0x17;
                  if (iVar5 == 0) {
                    bVar3 = true;
                    uVar9 = local_78;
                  }
                  else {
                    p_Var6 = xlogging_get_log_function();
                    bVar2 = true;
                    uVar9 = local_78;
                    if (p_Var6 != (LOGGER_LOG)0x0) {
                      (*p_Var6)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                                ,"on_message_received",0x117,1,"Cannot remove pending operation");
                      uVar9 = local_78;
                    }
                  }
                }
                if (uVar9 != uVar1) {
                  item_handle = singlylinkedlist_get_next_item(item_handle);
                  iVar4 = 0;
                }
              }
            } while (iVar4 == 0);
            key = local_48;
            value = local_50;
            if (bVar2) {
              (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
              pAVar7 = messaging_delivery_released();
            }
            else if (bVar3) {
              pAVar7 = messaging_delivery_accepted();
            }
            else {
              p_Var6 = xlogging_get_log_function();
              if (p_Var6 != (LOGGER_LOG)0x0) {
                (*p_Var6)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                          ,"on_message_received",0x134,1,
                          "Could not match AMQP management response to request");
              }
              (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
              pAVar7 = messaging_delivery_rejected
                                 ("amqp:internal-error",
                                  "Could not match AMQP management response to request");
            }
            if (local_60 != (AMQP_VALUE)0x0) {
              amqpvalue_destroy(local_60);
            }
            amqpvalue_destroy(local_58);
          }
        }
        else {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            (*p_Var6)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                      ,"on_message_received",0xb1,1,"Could not retrieve status code int value");
          }
          (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
          pAVar7 = messaging_delivery_rejected
                             ("amqp:internal-error",
                              "Could not retrieve status code value from the application properties in the AMQP management response."
                             );
        }
        amqpvalue_destroy(value);
      }
      amqpvalue_destroy(key);
    }
  }
  else {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      pcVar10 = "Could not retrieve correlation Id";
      iVar4 = 0x75;
LAB_00129edf:
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                ,"on_message_received",iVar4,1,pcVar10);
    }
LAB_00129eea:
    (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
    pcVar10 = "Could not get correlation Id from AMQP management response.";
LAB_00129eff:
    pAVar7 = messaging_delivery_rejected("amqp:internal-error",pcVar10);
  }
  properties_destroy(local_70);
LAB_00129f11:
  amqpvalue_destroy(local_68);
  return pAVar7;
}

Assistant:

static AMQP_VALUE on_message_received(const void* context, MESSAGE_HANDLE message)
{
    AMQP_VALUE result;

    if (context == NULL)
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_108: [ When `on_message_received` is called with a NULL context, it shall do nothing. ]*/
        LogError("NULL context in on_message_received");
        result = NULL;
    }
    else
    {
        AMQP_MANAGEMENT_HANDLE amqp_management = (AMQP_MANAGEMENT_HANDLE)context;
        AMQP_VALUE application_properties;

        /* Codes_SRS_AMQP_MANAGEMENT_01_109: [ `on_message_received` shall obtain the application properties from the message by calling `message_get_application_properties`. ]*/
        if (message_get_application_properties(message, &application_properties) != 0)
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_113: [ If obtaining the application properties or message properties fails, an error shall be indicated by calling `on_amqp_management_error` and passing the `on_amqp_management_error_context` to it. ]*/
            LogError("Could not retrieve application properties");
            amqp_management->on_amqp_management_error(amqp_management->on_amqp_management_error_context);
            /* Codes_SRS_AMQP_MANAGEMENT_01_136: [ When `on_message_received` fails due to errors in parsing the response message `on_message_received` shall call `messaging_delivery_rejected` and return the created delivery AMQP value. ]*/
            result = messaging_delivery_rejected("amqp:internal-error", "Could not get application properties on AMQP management response.");
        }
        else
        {
            PROPERTIES_HANDLE response_properties;

            /* Codes_SRS_AMQP_MANAGEMENT_01_110: [ `on_message_received` shall obtain the message properties from the message by calling `message_get_properties`. ]*/
            if (message_get_properties(message, &response_properties) != 0)
            {
                /* Codes_SRS_AMQP_MANAGEMENT_01_113: [ If obtaining the application properties or message properties fails, an error shall be indicated by calling `on_amqp_management_error` and passing the `on_amqp_management_error_context` to it. ]*/
                LogError("Could not retrieve message properties");
                amqp_management->on_amqp_management_error(amqp_management->on_amqp_management_error_context);
                /* Codes_SRS_AMQP_MANAGEMENT_01_136: [ When `on_message_received` fails due to errors in parsing the response message `on_message_received` shall call `messaging_delivery_rejected` and return the created delivery AMQP value. ]*/
                result = messaging_delivery_rejected("amqp:internal-error", "Could not get message properties on AMQP management response.");
            }
            else
            {
                AMQP_VALUE key;
                AMQP_VALUE value;
                AMQP_VALUE desc_key;
                AMQP_VALUE desc_value;
                AMQP_VALUE map;
                AMQP_VALUE correlation_id_value;
                uint64_t correlation_id;

                /* Codes_SRS_AMQP_MANAGEMENT_01_111: [ `on_message_received` shall obtain the correlation Id from the message properties by using `properties_get_correlation_id`. ]*/
                if (properties_get_correlation_id(response_properties, &correlation_id_value) != 0)
                {
                    /* Codes_SRS_AMQP_MANAGEMENT_01_114: [ If obtaining the correlation Id fails, an error shall be indicated by calling `on_amqp_management_error` and passing the `on_amqp_management_error_context` to it. ] */
                    LogError("Could not retrieve correlation Id");
                    amqp_management->on_amqp_management_error(amqp_management->on_amqp_management_error_context);
                    /* Codes_SRS_AMQP_MANAGEMENT_01_136: [ When `on_message_received` fails due to errors in parsing the response message `on_message_received` shall call `messaging_delivery_rejected` and return the created delivery AMQP value. ]*/
                    result = messaging_delivery_rejected("amqp:internal-error", "Could not get correlation Id from AMQP management response.");
                }
                else
                {
                    if (amqpvalue_get_ulong(correlation_id_value, &correlation_id) != 0)
                    {
                        /* Codes_SRS_AMQP_MANAGEMENT_01_132: [ If any functions manipulating AMQP values, application properties, etc., fail, an error shall be indicated to the consumer by calling the `on_amqp_management_error` and passing the `on_amqp_management_error_context` to it. ]*/
                        LogError("Could not retrieve correlation Id ulong value");
                        amqp_management->on_amqp_management_error(amqp_management->on_amqp_management_error_context);
                        /* Codes_SRS_AMQP_MANAGEMENT_01_136: [ When `on_message_received` fails due to errors in parsing the response message `on_message_received` shall call `messaging_delivery_rejected` and return the created delivery AMQP value. ]*/
                        result = messaging_delivery_rejected("amqp:internal-error", "Could not get correlation Id from AMQP management response.");
                    }
                    else
                    {
                        /* Codes_SRS_AMQP_MANAGEMENT_01_119: [ `on_message_received` shall obtain the application properties map by calling `amqpvalue_get_inplace_described_value`. ]*/
                        /* Codes_SRS_AMQP_MANAGEMENT_01_070: [ Response messages have the following application-properties: ]*/
                        map = amqpvalue_get_inplace_described_value(application_properties);
                        if (map == NULL)
                        {
                            /* Codes_SRS_AMQP_MANAGEMENT_01_132: [ If any functions manipulating AMQP values, application properties, etc., fail, an error shall be indicated to the consumer by calling the `on_amqp_management_error` and passing the `on_amqp_management_error_context` to it. ]*/
                            LogError("Could not retrieve application property map");
                            amqp_management->on_amqp_management_error(amqp_management->on_amqp_management_error_context);
                            /* Codes_SRS_AMQP_MANAGEMENT_01_136: [ When `on_message_received` fails due to errors in parsing the response message `on_message_received` shall call `messaging_delivery_rejected` and return the created delivery AMQP value. ]*/
                            result = messaging_delivery_rejected("amqp:internal-error", "Could not get application property map from the application properties in the AMQP management response.");
                        }
                        else
                        {
                            /* Codes_SRS_AMQP_MANAGEMENT_01_120: [ An AMQP value used to lookup the status code shall be created by calling `amqpvalue_create_string` with the status code key name (`statusCode`) as argument. ]*/
                            /* Codes_SRS_AMQP_MANAGEMENT_01_071: [ statusCode integer Yes HTTP response code [RFC2616] ]*/
                            key = amqpvalue_create_string(amqp_management->status_code_key_name);
                            if (key == NULL)
                            {
                                /* Codes_SRS_AMQP_MANAGEMENT_01_132: [ If any functions manipulating AMQP values, application properties, etc., fail, an error shall be indicated to the consumer by calling the `on_amqp_management_error` and passing the `on_amqp_management_error_context` to it. ]*/
                                LogError("Could not create status-code amqp value");
                                amqp_management->on_amqp_management_error(amqp_management->on_amqp_management_error_context);
                                /* Codes_SRS_AMQP_MANAGEMENT_01_135: [ When an error occurs in creating AMQP values (for status code, etc.) `on_message_received` shall call `messaging_delivery_released` and return the created delivery AMQP value. ]*/
                                result = messaging_delivery_released();
                            }
                            else
                            {
                                /* Codes_SRS_AMQP_MANAGEMENT_01_121: [ The status code shall be looked up in the application properties by using `amqpvalue_get_map_value`. ]*/
                                value = amqpvalue_get_map_value(map, key);
                                if (value == NULL)
                                {
                                    /* Codes_SRS_AMQP_MANAGEMENT_01_122: [ If status code is not found an error shall be indicated to the consumer by calling the `on_amqp_management_error` and passing the `on_amqp_management_error_context` to it. ]*/
                                    LogError("Could not retrieve status code from application properties");
                                    amqp_management->on_amqp_management_error(amqp_management->on_amqp_management_error_context);
                                    /* Codes_SRS_AMQP_MANAGEMENT_01_136: [ When `on_message_received` fails due to errors in parsing the response message `on_message_received` shall call `messaging_delivery_rejected` and return the created delivery AMQP value. ]*/
                                    result = messaging_delivery_rejected("amqp:internal-error", "Could not retrieve status code from the application properties in the AMQP management response.");
                                }
                                else
                                {
                                    int32_t status_code;
                                    /* Codes_SRS_AMQP_MANAGEMENT_01_133: [ The status code value shall be extracted from the value found in the map by using `amqpvalue_get_int`. ]*/
                                    if (amqpvalue_get_int(value, &status_code) != 0)
                                    {
                                        /* Codes_SRS_AMQP_MANAGEMENT_01_132: [ If any functions manipulating AMQP values, application properties, etc., fail, an error shall be indicated to the consumer by calling the `on_amqp_management_error` and passing the `on_amqp_management_error_context` to it. ]*/
                                        LogError("Could not retrieve status code int value");
                                        amqp_management->on_amqp_management_error(amqp_management->on_amqp_management_error_context);
                                        /* Codes_SRS_AMQP_MANAGEMENT_01_136: [ When `on_message_received` fails due to errors in parsing the response message `on_message_received` shall call `messaging_delivery_rejected` and return the created delivery AMQP value. ]*/
                                        result = messaging_delivery_rejected("amqp:internal-error", "Could not retrieve status code value from the application properties in the AMQP management response.");
                                    }
                                    else
                                    {
                                        /* Codes_SRS_AMQP_MANAGEMENT_01_123: [ An AMQP value used to lookup the status description shall be created by calling `amqpvalue_create_string` with the status description key name (`statusDescription`) as argument. ]*/
                                        /* Codes_SRS_AMQP_MANAGEMENT_01_072: [ statusDescription string No Description of the status. ]*/
                                        desc_key = amqpvalue_create_string(amqp_management->status_description_key_name);
                                        if (desc_key == NULL)
                                        {
                                            /* Codes_SRS_AMQP_MANAGEMENT_01_132: [ If any functions manipulating AMQP values, application properties, etc., fail, an error shall be indicated to the consumer by calling the `on_amqp_management_error` and passing the `on_amqp_management_error_context` to it. ]*/
                                            LogError("Could not create status-description amqp value");
                                            amqp_management->on_amqp_management_error(amqp_management->on_amqp_management_error_context);
                                            /* Codes_SRS_AMQP_MANAGEMENT_01_135: [ When an error occurs in creating AMQP values (for status code, etc.) `on_message_received` shall call `messaging_delivery_released` and return the created delivery AMQP value. ]*/
                                            result = messaging_delivery_released();
                                        }
                                        else
                                        {
                                            const char* status_description = NULL;
                                            LIST_ITEM_HANDLE list_item_handle;
                                            bool found = false;
                                            bool is_error = false;

                                            /* Codes_SRS_AMQP_MANAGEMENT_01_124: [ The status description shall be looked up in the application properties by using `amqpvalue_get_map_value`. ]*/
                                            desc_value = amqpvalue_get_map_value(map, desc_key);
                                            if (desc_value != NULL)
                                            {
                                                /* Codes_SRS_AMQP_MANAGEMENT_01_134: [ The status description value shall be extracted from the value found in the map by using `amqpvalue_get_string`. ]*/
                                                if (amqpvalue_get_string(desc_value, &status_description) != 0)
                                                {
                                                    /* Codes_SRS_AMQP_MANAGEMENT_01_125: [ If status description is not found, NULL shall be passed to the user callback as `status_description` argument. ]*/
                                                    status_description = NULL;
                                                }
                                            }
                                            else
                                            {
                                                /* Codes_SRS_AMQP_MANAGEMENT_01_125: [ If status description is not found, NULL shall be passed to the user callback as `status_description` argument. ]*/
                                                status_description = NULL;
                                            }

                                            list_item_handle = singlylinkedlist_get_head_item(amqp_management->pending_operations);
                                            while (list_item_handle != NULL)
                                            {
                                                /* Codes_SRS_AMQP_MANAGEMENT_01_116: [ Each pending operation item value shall be obtained by calling `singlylinkedlist_item_get_value`. ]*/
                                                OPERATION_MESSAGE_INSTANCE* operation_message = (OPERATION_MESSAGE_INSTANCE*)singlylinkedlist_item_get_value(list_item_handle);
                                                if (operation_message == NULL)
                                                {
                                                    /* Codes_SRS_AMQP_MANAGEMENT_01_117: [ If iterating through the pending operations list fails, an error shall be indicated by calling `on_amqp_management_error` and passing the `on_amqp_management_error_context` to it. ]*/
                                                    LogError("Could not create status-description amqp value");
                                                    amqp_management->on_amqp_management_error(amqp_management->on_amqp_management_error_context);
                                                    /* Codes_SRS_AMQP_MANAGEMENT_01_135: [ When an error occurs in creating AMQP values (for status code, etc.) `on_message_received` shall call `messaging_delivery_released` and return the created delivery AMQP value. ]*/
                                                    messaging_delivery_released();
                                                    break;
                                                }
                                                else
                                                {
                                                    AMQP_MANAGEMENT_EXECUTE_OPERATION_RESULT execute_operation_result;

                                                    /* Codes_SRS_AMQP_MANAGEMENT_01_112: [ `on_message_received` shall check if the correlation Id matches the stored message Id of any pending operation. ]*/
                                                    /* Codes_SRS_AMQP_MANAGEMENT_01_068: [ The correlation-id of the response message MUST be the correlation-id from the request message (if present) ]*/
                                                    /* Codes_SRS_AMQP_MANAGEMENT_01_069: [ else the message-id from the request message. ]*/
                                                    if (correlation_id == operation_message->message_id)
                                                    {
                                                        if (!operation_message->message_send_confirmed)
                                                        {
                                                            LogError("Did not receive send confirmation for pending operation");
                                                            execute_operation_result = AMQP_MANAGEMENT_EXECUTE_OPERATION_FAILED_BAD_STATUS;

                                                            if (async_operation_cancel(operation_message->send_async_context) != 0)
                                                            {
                                                                LogError("Failed cancelling pending send operation");
                                                                is_error = true;
                                                            }
                                                        }
                                                        /* Codes_SRS_AMQP_MANAGEMENT_01_074: [ Successful operations MUST result in a statusCode in the 2xx range as defined in Section 10.2 of [RFC2616]. ]*/
                                                        else if ((status_code < 200) || (status_code > 299))
                                                        {
                                                            /* Codes_SRS_AMQP_MANAGEMENT_01_128: [ If the status indicates that the operation failed, the result callback argument shall be `AMQP_MANAGEMENT_EXECUTE_OPERATION_FAILED_BAD_STATUS`. ]*/
                                                            /* Codes_SRS_AMQP_MANAGEMENT_01_075: [ Unsuccessful operations MUST NOT result in a statusCode in the 2xx range as defined in Section 10.2 of [RFC2616]. ]*/
                                                            execute_operation_result = AMQP_MANAGEMENT_EXECUTE_OPERATION_FAILED_BAD_STATUS;
                                                        }
                                                        else
                                                        {
                                                            /* Codes_SRS_AMQP_MANAGEMENT_01_127: [ If the operation succeeded the result callback argument shall be `AMQP_MANAGEMENT_EXECUTE_OPERATION_OK`. ]*/
                                                            execute_operation_result = AMQP_MANAGEMENT_EXECUTE_OPERATION_OK;
                                                        }

                                                        /* Codes_SRS_AMQP_MANAGEMENT_01_126: [ If a corresponding correlation Id is found in the pending operations list, the callback associated with the pending operation shall be called. ]*/
                                                        /* Codes_SRS_AMQP_MANAGEMENT_01_166: [ The `message` shall be passed as argument to the callback. ]*/
                                                        if (operation_message->on_execute_operation_complete != NULL)
                                                        {
                                                            // Check for NULL in case operation has been cancelled.
                                                            operation_message->on_execute_operation_complete(operation_message->callback_context, execute_operation_result, status_code, status_description, message);
                                                        }

                                                        async_operation_destroy(operation_message->execute_async_operation);

                                                        /* Codes_SRS_AMQP_MANAGEMENT_01_129: [ After calling the callback, the pending operation shall be removed from the pending operations list by calling `singlylinkedlist_remove`. ]*/
                                                        if (singlylinkedlist_remove(amqp_management->pending_operations, list_item_handle) != 0)
                                                        {
                                                            LogError("Cannot remove pending operation");
                                                            is_error = true;
                                                        }
                                                        else
                                                        {
                                                            found = true;
                                                        }

                                                        break;
                                                    }
                                                }

                                                /* Codes_SRS_AMQP_MANAGEMENT_01_115: [ Iterating through the pending operations shall be done by using `singlylinkedlist_get_head_item` and `singlylinkedlist_get_next_item` until the enm of the pending operations singly linked list is reached. ]*/
                                                /* Codes_SRS_AMQP_MANAGEMENT_01_117: [ If iterating through the pending operations list fails, an error shall be indicated by calling `on_amqp_management_error` and passing the `on_amqp_management_error_context` to it. ]*/
                                                list_item_handle = singlylinkedlist_get_next_item(list_item_handle);
                                            }

                                            if (is_error)
                                            {
                                                /* Codes_SRS_AMQP_MANAGEMENT_01_117: [ If iterating through the pending operations list fails, an error shall be indicated by calling `on_amqp_management_error` and passing the `on_amqp_management_error_context` to it. ]*/
                                                amqp_management->on_amqp_management_error(amqp_management->on_amqp_management_error_context);
                                                /* Codes_SRS_AMQP_MANAGEMENT_01_135: [ When an error occurs in creating AMQP values (for status code, etc.) `on_message_received` shall call `messaging_delivery_released` and return the created delivery AMQP value. ]*/
                                                result = messaging_delivery_released();
                                            }
                                            else
                                            {
                                                if (!found)
                                                {
                                                    /* Codes_SRS_AMQP_MANAGEMENT_01_118: [ If no pending operation is found matching the correlation Id, an error shall be indicated by calling `on_amqp_management_error` and passing the `on_amqp_management_error_context` to it. ]*/
                                                    LogError("Could not match AMQP management response to request");
                                                    amqp_management->on_amqp_management_error(amqp_management->on_amqp_management_error_context);
                                                    /* Codes_SRS_AMQP_MANAGEMENT_01_135: [ When an error occurs in creating AMQP values (for status code, etc.) `on_message_received` shall call `messaging_delivery_released` and return the created delivery AMQP value. ]*/
                                                    result = messaging_delivery_rejected("amqp:internal-error", "Could not match AMQP management response to request");
                                                }
                                                else
                                                {
                                                    /* Codes_SRS_AMQP_MANAGEMENT_01_130: [ The `on_message_received` shall call `messaging_delivery_accepted` and return the created delivery AMQP value. ]*/
                                                    result = messaging_delivery_accepted();
                                                }
                                            }

                                            if (desc_value != NULL)
                                            {
                                                /* Codes_SRS_AMQP_MANAGEMENT_01_131: [ All temporary values like AMQP values used as keys shall be freed before exiting the callback. ]*/
                                                amqpvalue_destroy(desc_value);
                                            }

                                            /* Codes_SRS_AMQP_MANAGEMENT_01_131: [ All temporary values like AMQP values used as keys shall be freed before exiting the callback. ]*/
                                            amqpvalue_destroy(desc_key);
                                        }
                                    }

                                    /* Codes_SRS_AMQP_MANAGEMENT_01_131: [ All temporary values like AMQP values used as keys shall be freed before exiting the callback. ]*/
                                    amqpvalue_destroy(value);
                                }

                                /* Codes_SRS_AMQP_MANAGEMENT_01_131: [ All temporary values like AMQP values used as keys shall be freed before exiting the callback. ]*/
                                amqpvalue_destroy(key);
                            }
                        }
                    }
                }

                /* Codes_SRS_AMQP_MANAGEMENT_01_131: [ All temporary values like AMQP values used as keys shall be freed before exiting the callback. ]*/
                properties_destroy(response_properties);
            }

            /* Codes_SRS_AMQP_MANAGEMENT_01_131: [ All temporary values like AMQP values used as keys shall be freed before exiting the callback. ]*/
            application_properties_destroy(application_properties);
        }
    }

    return result;
}